

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O1

parser_error visuals_parse_cycle(parser *parser)

{
  char *__s2;
  long lVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  char *pcVar6;
  char *name;
  visuals_color_cycle *pvVar7;
  parser_error pVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  pvVar4 = parser_priv(parser);
  pVar8 = PARSE_ERROR_INTERNAL;
  if (pvVar4 != (void *)0x0) {
    uVar5 = *(long *)((long)pvVar4 + 0x20) + 1;
    *(ulong *)((long)pvVar4 + 0x20) = uVar5;
    pVar8 = PARSE_ERROR_TOO_MANY_ENTRIES;
    if (uVar5 < *(ulong *)((long)pvVar4 + 0x18)) {
      pcVar6 = parser_getsym(parser,"group");
      pVar8 = PARSE_ERROR_INVALID_VALUE;
      if ((((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) &&
          (name = parser_getsym(parser,"name"), name != (char *)0x0)) && (*name != '\0')) {
        if (*(long *)(*(long *)((long)pvVar4 + 0x10) + *(long *)((long)pvVar4 + 0x20) * 8) == 0) {
          pvVar7 = visuals_color_cycle_new(name,0x20,0xff);
          lVar11 = *(long *)((long)pvVar4 + 0x20);
          *(visuals_color_cycle **)(*(long *)((long)pvVar4 + 0x10) + lVar11 * 8) = pvVar7;
          if (*(long *)(*(long *)((long)pvVar4 + 0x10) + lVar11 * 8) == 0) {
            return PARSE_ERROR_INTERNAL;
          }
        }
        uVar5 = *(ulong *)((long)pvVar4 + 0x38);
        uVar9 = uVar5;
        if (uVar5 != 0) {
          lVar11 = *(long *)((long)pvVar4 + 0x30);
          uVar10 = 0;
          while (__s2 = *(char **)(lVar11 + uVar10 * 8), uVar9 = uVar10, __s2 != (char *)0x0) {
            iVar3 = strcmp(pcVar6,__s2);
            if ((iVar3 == 0) || (uVar10 = uVar10 + 1, uVar9 = uVar5, uVar5 <= uVar10))
            goto LAB_001f30c7;
          }
          pcVar6 = string_make(pcVar6);
          *(char **)(*(long *)((long)pvVar4 + 0x30) + uVar10 * 8) = pcVar6;
        }
LAB_001f30c7:
        uVar9 = uVar9 << 6;
        uVar5 = *(ulong *)((long)pvVar4 + 0x48);
        lVar11 = 0x40;
        do {
          if (uVar9 < uVar5) {
            lVar1 = *(long *)((long)pvVar4 + 0x40);
            lVar2 = *(long *)(lVar1 + uVar9 * 8);
            if ((lVar2 == 0) ||
               ((pcVar6 = *(char **)(lVar2 + 0x10), pcVar6 != (char *)0x0 &&
                (iVar3 = strcmp(name,pcVar6), iVar3 == 0)))) {
              *(undefined8 *)(lVar1 + uVar9 * 8) =
                   *(undefined8 *)
                    (*(long *)((long)pvVar4 + 0x10) + *(long *)((long)pvVar4 + 0x20) * 8);
              break;
            }
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
        *(undefined8 *)((long)pvVar4 + 0x28) = 0;
        pVar8 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar8;
}

Assistant:

static enum parser_error visuals_parse_cycle(struct parser *parser)
{
	struct visuals_parse_context *context = parser_priv(parser);
	const char *parsed_group = NULL;
	const char *parsed_name = NULL;
	size_t i = 0;
	size_t current_group_index = 0;

	if (context == NULL) {
		return PARSE_ERROR_INTERNAL;
	}

	/* Move to the next available slot in the cycle list. This will start the
	 * list at 1 (instead of zero), but we need to use cycles_index to keep
	 * track of which cycle we will be adding colors to. */
	context->cycles_index++;

	if (context->cycles_index >= context->max_cycles) {
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}

	parsed_group = parser_getsym(parser, "group");

	if (parsed_group == NULL || strlen(parsed_group) == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	parsed_name = parser_getsym(parser, "name");

	if (parsed_name == NULL || strlen(parsed_name) == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Create a new cycle with the maximum number of steps (if we can),
	 * otherwise bail. */
	if (context->cycles[context->cycles_index] == NULL) {
		context->cycles[context->cycles_index] = visuals_color_cycle_new(parsed_name,
																		 VISUALS_STEPS_MAX,
																		 VISUALS_INVALID_COLOR);

		if (context->cycles[context->cycles_index] == NULL) {
			return PARSE_ERROR_INTERNAL;
		}
	}

	/* Find the group that matches the parsed cycle's group or create a new one
	 * if not found. */
	current_group_index = context->max_groups;

	for (i = 0; i < context->max_groups; i++) {
		if (context->group_names[i] == NULL) {
			context->group_names[i] = string_make(parsed_group);
			current_group_index = i;
			break;
		}
		else {
			const char *existing_group = context->group_names[i];

			if (existing_group != NULL && streq(parsed_group, existing_group)) {
				current_group_index = i;
				break;
			}
		}
	}

	/* Assign the parsed cycle to its group. If a cycle with a matching name is
	 * found, the parsed cycle replaces that one, otherwise, it is added to the
	 * end of the group. */
	for (i = 0; i < VISUALS_CYCLES_MAX; i++) {
		size_t offset = current_group_index * VISUALS_CYCLES_MAX + i;

		if (offset >= context->max_group_cycles) {
			continue;
		}

		if (context->group_cycles[offset] == NULL) {
			context->group_cycles[offset] = context->cycles[context->cycles_index];
			break;
		}
		else {
			const char *existing_name = context->group_cycles[offset]->cycle_name;

			if (existing_name != NULL && streq(parsed_name, existing_name)) {
				context->group_cycles[offset] = context->cycles[context->cycles_index];
				break;
			}
		}
	}

	/* Reset the step index before we start adding colors to the cycle. */
	context->cycle_step_index = 0;

	return PARSE_ERROR_NONE;
}